

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O1

void obj_dosettracing(t_object *ob,int onoff)

{
  _outlet *p_Var1;
  t_pd *pp_Var2;
  _outconnect *p_Var3;
  t_backtracer *b;
  
  for (p_Var1 = ob->te_outlet; p_Var1 != (_outlet *)0x0; p_Var1 = p_Var1->o_next) {
    if (onoff == 0) {
      p_Var3 = p_Var1->o_connections;
      if ((p_Var3 == (_outconnect *)0x0) || (pp_Var2 = p_Var3->oc_to, *pp_Var2 != backtracer_class))
      {
        bug("obj_dosettracing");
      }
      else {
        freebytes(p_Var3,0x10);
        p_Var1->o_connections = (_outconnect *)pp_Var2[1];
        freebytes(pp_Var2,0x18);
      }
    }
    else {
      pp_Var2 = pd_new(backtracer_class);
      pp_Var2[1] = (t_pd)0x0;
      pp_Var2[2] = (t_pd)ob;
      pp_Var2[1] = (t_pd)p_Var1->o_connections;
      p_Var3 = (_outconnect *)getbytes(0x10);
      p_Var1->o_connections = p_Var3;
      p_Var3->oc_next = (_outconnect *)0x0;
      p_Var3->oc_to = pp_Var2;
    }
  }
  return;
}

Assistant:

void obj_dosettracing(t_object *ob, int onoff)
{
    t_outlet *o;
    for (o = ob->ob_outlet; o; o = o->o_next)
    {
        if (onoff)
        {
            t_backtracer *b = backtracer_new(&ob->ob_pd);
            b->b_connections = o->o_connections;
            o->o_connections =  (t_outconnect *)t_getbytes(sizeof(t_outconnect));
            o->o_connections->oc_next = 0;
            o->o_connections->oc_to = &b->b_pd;
        }
        else if (o->o_connections &&
            (*o->o_connections->oc_to == backtracer_class))
        {
            t_backtracer *b = (t_backtracer *)o->o_connections->oc_to;
            t_freebytes(o->o_connections, sizeof(*o->o_connections));
            o->o_connections = b->b_connections;
            t_freebytes(b, sizeof(*b));
        }
        else bug("obj_dosettracing");
    }
}